

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLPostProcessor.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::PostProcessor::linkAndWriteFormulas(PostProcessor *this)

{
  int iVar1;
  Formulas *this_00;
  UniqueIdFormulaMap *pUVar2;
  _Base_ptr p_Var3;
  undefined4 extraout_var;
  char *__to;
  UI_STRING *uis;
  UI *ui;
  FormulasLinker formulasLinker;
  
  this_00 = (Formulas *)operator_new(0x28);
  COLLADAFW::Formulas::Formulas(this_00);
  pUVar2 = (this->super_DocumentProcessor).mFormulasMap;
  p_Var3 = (pUVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &(pUVar2->_M_t)._M_impl.super__Rb_tree_header) {
    COLLADAFW::ArrayPrimitiveType<COLLADAFW::Formula_*>::append
              (&this_00->mFormulas,(Formula **)&p_Var3[1]._M_right);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    pUVar2 = (this->super_DocumentProcessor).mFormulasMap;
  }
  ui = (UI *)this;
  FormulasLinker::FormulasLinker(&formulasLinker,&this->super_DocumentProcessor,&this_00->mFormulas)
  ;
  FormulasLinker::link(&formulasLinker,(char *)ui,__to);
  iVar1 = IFilePartLoader::writer((IFilePartLoader *)this,ui,uis);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xa0))
            ((long *)CONCAT44(extraout_var,iVar1),this_00);
  (*this_00->_vptr_Formulas[1])(this_00);
  FormulasLinker::~FormulasLinker(&formulasLinker);
  return;
}

Assistant:

void PostProcessor::linkAndWriteFormulas()
	{
		COLLADAFW::Formulas* formulas = FW_NEW COLLADAFW::Formulas();
		COLLADAFW::FormulaArray& formulaList = formulas->getFormulas();

		Loader::UniqueIdFormulaMap::const_iterator it = mFormulasMap.begin();
		for (; it != mFormulasMap.end(); ++it)
		{
			formulaList.append( it->second );
		}

		FormulasLinker formulasLinker(this, formulaList);
		formulasLinker.link();

		writer()->writeFormulas(formulas);
		FW_DELETE formulas;
	}